

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderCompilationCases.cpp
# Opt level: O2

string * deqp::gles2::Performance::singleVaryingFragmentTemplate_abi_cxx11_(void)

{
  string *in_RDI;
  allocator<char> local_9;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)in_RDI,
             "varying mediump vec4 v_value${NAME_SPEC};\n\nvoid main()\n{\n\tgl_FragColor = v_value${NAME_SPEC} + ${FLOAT01};\n${SEMANTIC_ERROR}}\n${INVALID_CHAR}"
             ,&local_9);
  return in_RDI;
}

Assistant:

static string singleVaryingFragmentTemplate (void)
{
	const char* resultTemplate =
		"varying mediump vec4 v_value${NAME_SPEC};\n"
		"\n"
		"void main()\n"
		"{\n"
		"	gl_FragColor = v_value${NAME_SPEC} + ${FLOAT01};\n"
		"${SEMANTIC_ERROR}"
		"}\n"
		"${INVALID_CHAR}";

	return resultTemplate;
}